

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cform.cxx
# Opt level: O0

void __thiscall xray_re::xr_cform::optimize(xr_cform *this)

{
  bool bVar1;
  pointer pcVar2;
  reference pvVar3;
  reference pvVar4;
  reference pcVar5;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  local_a8;
  const_iterator local_a0;
  cf_face *local_90;
  cf_face *local_88;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  local_80;
  const_iterator local_78;
  reference local_70;
  cf_face *face;
  uint_fast32_t next;
  cf_face_vec_it end;
  cf_face_vec_it it;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  local_48;
  const_iterator local_40;
  cf_face *local_30;
  cf_face *local_28;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  local_20;
  const_iterator local_18;
  xr_cform *local_10;
  xr_cform *this_local;
  
  local_10 = this;
  local_28 = (cf_face *)
             std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::begin(&this->m_faces)
  ;
  local_30 = (cf_face *)
             std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(&this->m_faces);
  local_20 = std::
             remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,face_degenerate_pred>
                       (local_28,local_30);
  __gnu_cxx::
  __normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
  ::__normal_iterator<xray_re::cf_face*>
            ((__normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
              *)&local_18,&local_20);
  local_48._M_current =
       (cf_face *)
       std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(&this->m_faces);
  __gnu_cxx::
  __normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
  ::__normal_iterator<xray_re::cf_face*>
            ((__normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
              *)&local_40,&local_48);
  std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::erase
            (&this->m_faces,local_18,local_40);
  generate_vertex_faces(this);
  end._M_current =
       (cf_face *)
       std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::begin(&this->m_faces);
  next = (uint_fast32_t)
         std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(&this->m_faces);
  while (bVar1 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
                                  *)&next), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
             ::operator->(&end);
    if ((pcVar2->field_1).dummy != 0xffffffff) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
               ::operator->(&end);
      pvVar3 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                         (&this->m_vertices,(ulong)(pcVar2->field_0).field_0.v[0]);
      face = (cf_face *)(ulong)pvVar3->face0;
      while (face != (cf_face *)0xffffffff) {
        pvVar4 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::operator[]
                           (&this->m_faces,(size_type)face);
        local_70 = pvVar4;
        pcVar5 = __gnu_cxx::
                 __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
                 ::operator*(&end);
        if (pcVar5 < pvVar4) {
          pcVar2 = __gnu_cxx::
                   __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
                   ::operator->(&end);
          bVar1 = cf_face::is_duplicate(pcVar2,local_70);
          if (bVar1) {
            (local_70->field_1).dummy = 0xffffffff;
          }
        }
        pvVar4 = local_70;
        pcVar2 = __gnu_cxx::
                 __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
                 ::operator->(&end);
        face = (cf_face *)cf_face::next_face_idx(pvVar4,(ulong)(pcVar2->field_0).field_0.v[0]);
      }
    }
    __gnu_cxx::
    __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
    ::operator++(&end);
  }
  local_88 = (cf_face *)
             std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::begin(&this->m_faces)
  ;
  local_90 = (cf_face *)
             std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(&this->m_faces);
  local_80 = std::
             remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,face_duplicate_pred>
                       (local_88,local_90);
  __gnu_cxx::
  __normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
  ::__normal_iterator<xray_re::cf_face*>
            ((__normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
              *)&local_78,&local_80);
  local_a8._M_current =
       (cf_face *)
       std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(&this->m_faces);
  __gnu_cxx::
  __normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
  ::__normal_iterator<xray_re::cf_face*>
            ((__normal_iterator<xray_re::cf_face_const*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>
              *)&local_a0,&local_a8);
  std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::erase
            (&this->m_faces,local_78,local_a0);
  generate_vertex_faces(this);
  return;
}

Assistant:

void xr_cform::optimize()
{
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_degenerate_pred()), m_faces.end());

	generate_vertex_faces();
	for (cf_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		if (it->dummy == BAD_IDX)
			continue;
		for (uint_fast32_t next = m_vertices[it->v0].face0; next != BAD_IDX;) {
			cf_face& face = m_faces[next];
			if (&face > &*it && it->is_duplicate(face))
				face.dummy = BAD_IDX;
			next = face.next_face_idx(it->v0);
		}
	}
//	size_t n = count_if(m_faces.begin(), m_faces.end(), is_duplicate());
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_duplicate_pred()), m_faces.end());
//	msg("CFORM optimize: was %"PRIuSIZE", left: %"PRIuSIZE"\n", n, m_faces.size());

	generate_vertex_faces();
}